

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

void __thiscall QListModeViewBase::clear(QListModeViewBase *this)

{
  QList<int> *in_RDI;
  
  QList<int>::clear(in_RDI);
  QList<int>::clear(in_RDI);
  QList<int>::clear(in_RDI);
  QList<int>::clear(in_RDI);
  *(undefined4 *)&in_RDI[6].d.size = 0;
  *(undefined4 *)&in_RDI[1].d.ptr = 0;
  *(undefined4 *)((long)&in_RDI[1].d.ptr + 4) = 0;
  return;
}

Assistant:

void QListModeViewBase::clear()
{
    flowPositions.clear();
    segmentPositions.clear();
    segmentStartRows.clear();
    segmentExtents.clear();
    batchSavedPosition = 0;
    batchStartRow = 0;
    batchSavedDeltaSeg = 0;
}